

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

mbedtls_ssl_mode_t mbedtls_ssl_get_mode_from_transform(mbedtls_ssl_transform *transform)

{
  mbedtls_cipher_mode_t mode;
  mbedtls_ssl_mode_t mVar1;
  int encrypt_then_mac;
  mbedtls_ssl_mode_t base_mode;
  mbedtls_ssl_transform *transform_local;
  
  mode = mbedtls_cipher_get_cipher_mode(&transform->cipher_ctx_enc);
  mVar1 = mbedtls_ssl_get_base_mode(mode);
  mVar1 = mbedtls_ssl_get_actual_mode(mVar1,0);
  return mVar1;
}

Assistant:

mbedtls_ssl_mode_t mbedtls_ssl_get_mode_from_transform(
    const mbedtls_ssl_transform *transform)
{
    mbedtls_ssl_mode_t base_mode = mbedtls_ssl_get_base_mode(
#if defined(MBEDTLS_USE_PSA_CRYPTO)
        transform->psa_alg
#else
        mbedtls_cipher_get_cipher_mode(&transform->cipher_ctx_enc)
#endif
        );

    int encrypt_then_mac = 0;
#if defined(MBEDTLS_SSL_SOME_SUITES_USE_CBC_ETM)
    encrypt_then_mac = transform->encrypt_then_mac;
#endif
    return mbedtls_ssl_get_actual_mode(base_mode, encrypt_then_mac);
}